

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::read_shape(basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
             *this,uint8_t info,error_code *ec)

{
  size_t *psVar1;
  pointer puVar2;
  iterator iVar3;
  bool bVar4;
  size_t in_RAX;
  uchar *puVar5;
  uint64_t uVar6;
  uchar *puVar7;
  ulong uVar8;
  size_t dim;
  
  puVar2 = (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  dim = in_RAX;
  if (info == '\x1f') {
    puVar5 = (this->source_).current_._M_current;
    puVar7 = (this->source_).end_._M_current;
    if (puVar5 != puVar7) {
      do {
        if (*puVar5 == 0xff) {
          if (puVar5 != puVar7) {
            psVar1 = &(this->source_).position_;
            *psVar1 = *psVar1 + 1;
            puVar5 = puVar5 + 1;
            (this->source_).current_._M_current = puVar5;
          }
        }
        else {
          dim = get_uint64_value(this,ec);
          if (ec->_M_value != 0) {
            return;
          }
          iVar3._M_current =
               (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->shape_,iVar3,
                       &dim);
          }
          else {
            *iVar3._M_current = dim;
            (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          puVar5 = (this->source_).current_._M_current;
          puVar7 = (this->source_).end_._M_current;
        }
      } while (puVar5 != puVar7);
    }
    std::error_code::operator=(ec,unexpected_eof);
    this->more_ = false;
  }
  else {
    uVar6 = get_uint64_value(this,ec);
    if (((ec->_M_value == 0) && (uVar6 != 0)) && (this->more_ != false)) {
      uVar8 = 1;
      while (dim = get_uint64_value(this,ec), ec->_M_value == 0) {
        iVar3._M_current =
             (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->shape_,iVar3,&dim
                    );
        }
        else {
          *iVar3._M_current = dim;
          (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        if (this->more_ != true) {
          return;
        }
        bVar4 = uVar6 <= uVar8;
        uVar8 = uVar8 + 1;
        if (bVar4) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void read_shape(uint8_t info, std::error_code& ec)
    {
        shape_.clear();
        switch (info)
        {
            case jsoncons::cbor::detail::additional_info::indefinite_length:
            {
                while (true)
                {
                    auto c = source_.peek();
                    if (JSONCONS_UNLIKELY(c.eof))
                    {
                        ec = cbor_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (c.value == 0xff)
                    {
                        source_.ignore(1);
                    }
                    else
                    {
                        std::size_t dim = get_size(ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                        shape_.push_back(dim);
                    }
                }
                break;
            }
            default:
            {
                std::size_t size = get_size(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                for (std::size_t i = 0; more_ && i < size; ++i)
                {
                    std::size_t dim = get_size(ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return;
                    }
                    shape_.push_back(dim);
                }
                break;
            }
        }
    }